

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.h
# Opt level: O3

BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
cmComputeLinkInformation::Item::GetFormattedItem
          (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Item *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string local_38;
  
  if (this->Feature == (FeatureDescriptor *)0x0) {
    pcVar2 = (path->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,pcVar2 + path->_M_string_length);
  }
  else {
    FeatureDescriptor::GetDecoratedItem(&local_38,this->Feature,path,this->IsPath);
  }
  peVar3 = (this->Value).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var4 = (this->Value).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  paVar1 = &(__return_storage_ptr__->Value).field_2;
  (__return_storage_ptr__->Value)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    paVar1->_M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->Value).field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->Value)._M_dataplus._M_p = local_38._M_dataplus._M_p;
    (__return_storage_ptr__->Value).field_2._M_allocated_capacity =
         local_38.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->Value)._M_string_length = local_38._M_string_length;
  (__return_storage_ptr__->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
  TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar3;
  (__return_storage_ptr__->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
  TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  return __return_storage_ptr__;
}

Assistant:

BT<std::string> GetFormattedItem(std::string const& path) const
    {
      return { (this->Feature != nullptr)
                 ? this->Feature->GetDecoratedItem(path, this->IsPath)
                 : path,
               Value.Backtrace };
    }